

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O3

void __thiscall
wasm::HashStringifyWalker::visitExpression(HashStringifyWalker *this,Expression *curr)

{
  pointer *pppEVar1;
  iterator __position;
  iterator __position_00;
  uint *__args;
  pair<std::__detail::_Node_iterator<std::pair<wasm::Expression_*const,_unsigned_int>,_false,_true>,_bool>
  pVar2;
  Expression *local_30;
  uint32_t local_28;
  Expression *local_20;
  Expression *curr_local;
  
  local_28 = this->nextVal;
  local_30 = curr;
  local_20 = curr;
  pVar2 = std::
          _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,unsigned_int>,std::allocator<std::pair<wasm::Expression*const,unsigned_int>>,std::__detail::_Select1st,wasm::StringifyEquator,wasm::StringifyHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::Expression*const,unsigned_int>>
                    ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,unsigned_int>,std::allocator<std::pair<wasm::Expression*const,unsigned_int>>,std::__detail::_Select1st,wasm::StringifyEquator,wasm::StringifyHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->exprToCounter,&local_30);
  __args = (uint *)((long)pVar2.first.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_true>
                   + 0x10);
  __position._M_current =
       (this->hashString).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->hashString).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->hashString,__position,
               __args);
  }
  else {
    *__position._M_current = *__args;
    (this->hashString).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       (this->exprs).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->exprs).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    _M_realloc_insert<wasm::Expression*const&>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)&this->exprs,
               __position_00,&local_20);
  }
  else {
    *__position_00._M_current = local_20;
    pppEVar1 = &(this->exprs).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppEVar1 = *pppEVar1 + 1;
  }
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    this->nextVal = this->nextVal + 1;
  }
  return;
}

Assistant:

void HashStringifyWalker::visitExpression(Expression* curr) {
  auto [it, inserted] = exprToCounter.insert({curr, nextVal});
  hashString.push_back(it->second);
  exprs.push_back(curr);
  if (inserted) {
    nextVal++;
  }
}